

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::ShaderGLImpl::GetCompileStatus
          (ShaderGLImpl *this,IDataBlob **ppCompilerOutput,bool ThrowOnError)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *__dest;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  char *pcVar3;
  char (*in_R8) [35];
  bool bVar4;
  GLint compiled;
  int InfoLogLen;
  undefined4 uStack_204;
  vector<char,_std::allocator<char>_> InfoLog;
  int CharsWritten;
  string msg;
  
  compiled = 0;
  (*__glewGetShaderiv)((this->m_GLShaderObj).m_uiHandle,0x8b81,&compiled);
  InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  InfoLogLen = 0;
  (*__glewGetShaderiv)((this->m_GLShaderObj).m_uiHandle,0x8b84,&InfoLogLen);
  if (0 < (long)InfoLogLen) {
    std::vector<char,_std::allocator<char>_>::resize(&InfoLog,(long)InfoLogLen);
    CharsWritten = 0;
    (*__glewGetShaderInfoLog)
              ((this->m_GLShaderObj).m_uiHandle,InfoLogLen,&CharsWritten,
               InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (CharsWritten != InfoLogLen + -1) {
      FormatString<char[27]>(&msg,(char (*) [27])"Unexpected info log length");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetCompileStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x13d);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (ppCompilerOutput != (IDataBlob **)0x0) {
      DataBlobImpl::Create
                ((DataBlobImpl *)&msg,
                 (long)InfoLogLen + (this->m_GLSLSourceString)._M_string_length + 1,(void *)0x0);
      __dest = DataBlobImpl::GetDataPtr((DataBlobImpl *)msg._M_dataplus._M_p,0);
      if (InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        memcpy(__dest,InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(long)InfoLogLen);
      }
      memcpy((void *)((long)__dest + (long)InfoLogLen),(this->m_GLSLSourceString)._M_dataplus._M_p,
             (this->m_GLSLSourceString)._M_string_length + 1);
      DataBlobImpl::QueryInterface
                ((DataBlobImpl *)msg._M_dataplus._M_p,(INTERFACE_ID *)IID_DataBlob,
                 (IObject **)ppCompilerOutput);
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release((RefCntAutoPtr<Diligent::DataBlobImpl> *)&msg);
    }
  }
  if ((compiled != 0) &&
     (InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    bVar4 = true;
    goto LAB_002d40fb;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  paVar1 = &msg.field_2;
  pcVar3 = "Compiler output for shader \'";
  if (compiled == 0) {
    pcVar3 = "Failed to compile shader \'";
  }
  poVar2 = std::operator<<((ostream *)paVar1->_M_local_buf,pcVar3);
  poVar2 = std::operator<<(poVar2,(this->super_ShaderBase<Diligent::EngineGLImplTraits>).
                                  super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                                  .m_Desc.super_DeviceObjectAttribs.Name);
  std::operator<<(poVar2,"\'");
  if (InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (compiled == 0) {
      std::operator<<((ostream *)paVar1->_M_local_buf," (no shader log available).");
      goto LAB_002d3ff3;
    }
LAB_002d4091:
    std::__cxx11::stringbuf::str();
    FormatString<std::__cxx11::string>((string *)&InfoLogLen,(Diligent *)&CharsWritten,Args);
    std::__cxx11::string::~string((string *)&CharsWritten);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,CONCAT44(uStack_204,InfoLogLen),0,0,0);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)paVar1->_M_local_buf,":");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::write(paVar1->_M_local_buf,
                        (long)InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
LAB_002d3ff3:
    if (compiled != 0) goto LAB_002d4091;
    if (ppCompilerOutput == (IDataBlob **)0x0) {
      FormatString<char[62],std::__cxx11::string,char[35]>
                ((string *)&InfoLogLen,
                 (Diligent *)"Failed shader full source: \n\n>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",
                 (char (*) [62])&this->m_GLSLSourceString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\n<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<\n\n",in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(0,CONCAT44(uStack_204,InfoLogLen),0,0,0);
      }
      std::__cxx11::string::~string((string *)&InfoLogLen);
    }
    if (ThrowOnError) {
      std::__cxx11::stringbuf::str();
      LogError<true,std::__cxx11::string>
                (false,"GetCompileStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x171,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &InfoLogLen);
    }
    else {
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>((string *)&InfoLogLen,(Diligent *)&CharsWritten,Args_00);
      std::__cxx11::string::~string((string *)&CharsWritten);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,CONCAT44(uStack_204,InfoLogLen),0,0,0);
      }
    }
  }
  std::__cxx11::string::~string((string *)&InfoLogLen);
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  bVar4 = compiled != 0;
LAB_002d40fb:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&InfoLog.super__Vector_base<char,_std::allocator<char>_>);
  return bVar4;
}

Assistant:

bool ShaderGLImpl::GetCompileStatus(IDataBlob** ppCompilerOutput, bool ThrowOnError) noexcept(false)
{
    GLint compiled = GL_FALSE;
    // Get compilation status
    glGetShaderiv(m_GLShaderObj, GL_COMPILE_STATUS, &compiled);

    std::vector<GLchar> InfoLog;
    {
        int InfoLogLen = 0;
        // The function glGetShaderiv() tells how many bytes to allocate; the length includes the NULL terminator.
        glGetShaderiv(m_GLShaderObj, GL_INFO_LOG_LENGTH, &InfoLogLen);

        if (InfoLogLen > 0)
        {
            InfoLog.resize(InfoLogLen);

            int CharsWritten = 0;
            // Get the log. InfoLogLen is the size of InfoLog. This tells OpenGL how many bytes at maximum it will write
            // charsWritten is a return value, specifying how many bytes it actually wrote. One may pass NULL if he
            // doesn't care
            glGetShaderInfoLog(m_GLShaderObj, InfoLogLen, &CharsWritten, InfoLog.data());
            VERIFY(CharsWritten == InfoLogLen - 1, "Unexpected info log length");

            if (ppCompilerOutput != nullptr)
            {
                // InfoLogLen accounts for null terminator
                auto pOutputDataBlob = DataBlobImpl::Create(InfoLogLen + m_GLSLSourceString.length() + 1);

                char* DataPtr = pOutputDataBlob->GetDataPtr<char>();
                if (!InfoLog.empty())
                {
                    // Copy info log including null terminator
                    memcpy(DataPtr, InfoLog.data(), InfoLogLen);
                }
                // Copy source code including null terminator
                memcpy(DataPtr + InfoLogLen, m_GLSLSourceString.data(), m_GLSLSourceString.length() + 1);

                pOutputDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppCompilerOutput));
            }
        }
    }

    if (!compiled || !InfoLog.empty())
    {
        std::stringstream ss;
        ss << (compiled ? "Compiler output for shader '" : "Failed to compile shader '") << m_Desc.Name << "'";

        if (!InfoLog.empty())
        {
            ss << ":" << std::endl;
            ss.write(InfoLog.data(), InfoLog.size() - 1);
        }
        else if (!compiled)
        {
            ss << " (no shader log available).";
        }

        if (compiled)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            if (ppCompilerOutput == nullptr)
            {
                // Dump full source code to debug output
                LOG_INFO_MESSAGE("Failed shader full source: \n\n>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",
                                 m_GLSLSourceString,
                                 "\n<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<\n\n");
            }

            if (ThrowOnError)
            {
                LOG_ERROR_AND_THROW(ss.str());
            }
            else
            {
                LOG_ERROR_MESSAGE(ss.str());
            }
        }
    }

    return compiled != GL_FALSE;
}